

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_R_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Data_Query_R_PDU::Encode(Data_Query_R_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  reference puVar3;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_38;
  const_iterator citrVarEnd;
  const_iterator citrVar;
  const_iterator citrFixedEnd;
  const_iterator citrFixed;
  KDataStream *stream_local;
  Data_Query_R_PDU *this_local;
  
  Simulation_Management_Header::Encode((Simulation_Management_Header *)this,stream);
  Reliability_Header::Encode(&this->super_Reliability_Header,stream);
  pKVar2 = KDataStream::operator<<(stream,(this->super_Data_Query_PDU).m_ui32RequestID);
  pKVar2 = DATA_TYPE::operator<<
                     (pKVar2,&(this->super_Data_Query_PDU).m_TimeInterval.super_DataTypeBase);
  pKVar2 = KDataStream::operator<<(pKVar2,(this->super_Data_Query_PDU).m_ui32NumFixedDatum);
  KDataStream::operator<<(pKVar2,(this->super_Data_Query_PDU).m_ui32NumVariableDatum);
  citrFixedEnd = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (&(this->super_Data_Query_PDU).m_vFixedDatum);
  citrVar = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                      (&(this->super_Data_Query_PDU).m_vFixedDatum);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrFixedEnd,&citrVar);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&citrFixedEnd);
    KDataStream::operator<<(stream,*puVar3);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&citrFixedEnd);
  }
  citrVarEnd = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (&(this->super_Data_Query_PDU).m_vVariableDatum);
  local_38._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         (&(this->super_Data_Query_PDU).m_vVariableDatum);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrVarEnd,&local_38);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&citrVarEnd);
    KDataStream::operator<<(stream,*puVar3);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&citrVarEnd);
  }
  return;
}

Assistant:

void Data_Query_R_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );
    Reliability_Header::Encode( stream );

    stream << m_ui32RequestID
           << KDIS_STREAM m_TimeInterval
           << m_ui32NumFixedDatum
           << m_ui32NumVariableDatum;

    vector<KUINT32>::const_iterator citrFixed = m_vFixedDatum.begin();
    vector<KUINT32>::const_iterator citrFixedEnd = m_vFixedDatum.end();
    for( ; citrFixed != citrFixedEnd; ++citrFixed )
    {
        stream << *citrFixed;
    }

    vector<KUINT32>::const_iterator citrVar = m_vVariableDatum.begin();
    vector<KUINT32>::const_iterator citrVarEnd = m_vVariableDatum.end();
    for( ; citrVar != citrVarEnd; ++citrVar )
    {
        stream << *citrVar;
    }
}